

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::BayesianProbitRegressor::_InternalSerialize
          (BayesianProbitRegressor *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  uint8_t *puVar5;
  BayesianProbitRegressor_Gaussian *value;
  BayesianProbitRegressor_FeatureWeight *value_00;
  ulong uVar6;
  char *pcVar7;
  string *psVar8;
  void *data;
  uint local_28;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  BayesianProbitRegressor *this_local;
  
  uVar2 = _internal_numberoffeatures(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (uVar2 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    uVar2 = _internal_numberoffeatures(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1,uVar2,puVar5);
  }
  bVar1 = _internal_has_bias(this);
  if (bVar1) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _Internal::bias(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                             (2,value,puVar5,stream);
  }
  local_28 = 0;
  uVar3 = _internal_features_size(this);
  for (; local_28 < uVar3; local_28 = local_28 + 1) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _internal_features(this,local_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                             (3,value_00,puVar5,stream);
  }
  _internal_regressioninputfeaturename_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    _internal_regressioninputfeaturename_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    _internal_regressioninputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar7,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    psVar8 = _internal_regressioninputfeaturename_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,10,psVar8,(uint8_t *)stream_local);
  }
  _internal_optimisminputfeaturename_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    _internal_optimisminputfeaturename_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    _internal_optimisminputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar7,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    psVar8 = _internal_optimisminputfeaturename_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0xb,psVar8,(uint8_t *)stream_local);
  }
  _internal_samplingscaleinputfeaturename_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    _internal_samplingscaleinputfeaturename_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    _internal_samplingscaleinputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar7,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    psVar8 = _internal_samplingscaleinputfeaturename_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0xc,psVar8,(uint8_t *)stream_local);
  }
  _internal_samplingtruncationinputfeaturename_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    _internal_samplingtruncationinputfeaturename_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    _internal_samplingtruncationinputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar7,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    psVar8 = _internal_samplingtruncationinputfeaturename_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0xd,psVar8,(uint8_t *)stream_local);
  }
  _internal_meanoutputfeaturename_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    _internal_meanoutputfeaturename_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    _internal_meanoutputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar7,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    psVar8 = _internal_meanoutputfeaturename_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0x14,psVar8,(uint8_t *)stream_local);
  }
  _internal_varianceoutputfeaturename_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    _internal_varianceoutputfeaturename_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    _internal_varianceoutputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar7,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    psVar8 = _internal_varianceoutputfeaturename_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0x15,psVar8,(uint8_t *)stream_local);
  }
  _internal_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    _internal_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    _internal_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar7,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"
              );
    psVar8 = _internal_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0x16,psVar8,(uint8_t *)stream_local);
  }
  _internal_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    _internal_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    _internal_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar7,iVar4,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    psVar8 = _internal_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0x17,psVar8,(uint8_t *)stream_local);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar4 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar4,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* BayesianProbitRegressor::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BayesianProbitRegressor)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 numberOfFeatures = 1;
  if (this->_internal_numberoffeatures() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt32ToArray(1, this->_internal_numberoffeatures(), target);
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->_internal_has_bias()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::bias(this), target, stream);
  }

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_features_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_features(i), target, stream);
  }

  // string regressionInputFeatureName = 10;
  if (!this->_internal_regressioninputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_regressioninputfeaturename().data(), static_cast<int>(this->_internal_regressioninputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        10, this->_internal_regressioninputfeaturename(), target);
  }

  // string optimismInputFeatureName = 11;
  if (!this->_internal_optimisminputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_optimisminputfeaturename().data(), static_cast<int>(this->_internal_optimisminputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        11, this->_internal_optimisminputfeaturename(), target);
  }

  // string samplingScaleInputFeatureName = 12;
  if (!this->_internal_samplingscaleinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_samplingscaleinputfeaturename().data(), static_cast<int>(this->_internal_samplingscaleinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_samplingscaleinputfeaturename(), target);
  }

  // string samplingTruncationInputFeatureName = 13;
  if (!this->_internal_samplingtruncationinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_samplingtruncationinputfeaturename().data(), static_cast<int>(this->_internal_samplingtruncationinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_samplingtruncationinputfeaturename(), target);
  }

  // string meanOutputFeatureName = 20;
  if (!this->_internal_meanoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_meanoutputfeaturename().data(), static_cast<int>(this->_internal_meanoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        20, this->_internal_meanoutputfeaturename(), target);
  }

  // string varianceOutputFeatureName = 21;
  if (!this->_internal_varianceoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_varianceoutputfeaturename().data(), static_cast<int>(this->_internal_varianceoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        21, this->_internal_varianceoutputfeaturename(), target);
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (!this->_internal_pessimisticprobabilityoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_pessimisticprobabilityoutputfeaturename().data(), static_cast<int>(this->_internal_pessimisticprobabilityoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        22, this->_internal_pessimisticprobabilityoutputfeaturename(), target);
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (!this->_internal_sampledprobabilityoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_sampledprobabilityoutputfeaturename().data(), static_cast<int>(this->_internal_sampledprobabilityoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        23, this->_internal_sampledprobabilityoutputfeaturename(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BayesianProbitRegressor)
  return target;
}